

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O2

bool __thiscall
kws::Generator::GenerateDart
          (Generator *this,char *dir,int maxError,bool group,string *url,double time,
          string *basedirectory)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  char *format;
  char *format_00;
  pointer pEVar8;
  uint uVar9;
  Parser *this_00;
  double dVar10;
  int local_7e0;
  string sourcefile;
  string dirname;
  string desc;
  ErrorVectorType errors;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  string configname;
  string tag;
  string currentLine;
  string filename;
  ofstream file;
  string local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ifstream configfile;
  ifstream tagfile;
  
  std::operator<<((ostream *)&std::cout,"Generating Dart...");
  std::__cxx11::string::string((string *)&dirname,dir,(allocator *)&tagfile);
  sVar3 = strlen(dir);
  if ((dir[sVar3 - 1] != '/') && (dir[sVar3 - 1] != '\\')) {
    std::__cxx11::string::append((char *)&dirname);
  }
  std::__cxx11::string::append((char *)&dirname);
  std::operator+(&tag,&dirname,"TAG");
  std::ifstream::ifstream(&tagfile);
  std::ifstream::open((char *)&tagfile,(_Ios_Openmode)tag._M_dataplus._M_p);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar5 = std::operator<<((ostream *)&std::cout,"Cannot open file for reading: ");
    poVar5 = std::operator<<(poVar5,tag._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar5);
    cVar2 = '\0';
  }
  else {
    pcVar4 = (char *)operator_new__(0xff);
    std::istream::getline((char *)&tagfile,(long)pcVar4);
    sVar3 = strlen(pcVar4);
    if (pcVar4[sVar3 - 1] == '\r') {
      pcVar4[sVar3 - 1] = '\0';
    }
    std::__cxx11::string::append((char *)&dirname);
    std::__cxx11::string::append((char *)&dirname);
    operator_delete__(pcVar4);
    std::operator+(&configname,&dirname,"Configure.xml");
    std::ifstream::ifstream(&configfile);
    std::ifstream::open((char *)&configfile,(_Ios_Openmode)configname._M_dataplus._M_p);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,"Cannot open file for reading: ");
      poVar5 = std::operator<<(poVar5,configname._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar5);
      cVar2 = '\0';
    }
    else {
      std::ofstream::ofstream(&file);
      std::operator+(&filename,&dirname,"Build.xml");
      std::ofstream::open((char *)&file,(_Ios_Openmode)filename._M_dataplus._M_p);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        poVar5 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        pcVar4 = (char *)operator_new__(0xff);
        std::istream::getline((char *)&configfile,(long)pcVar4);
        poVar5 = std::operator<<((ostream *)&file,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::istream::getline((char *)&configfile,(long)pcVar4);
        poVar5 = std::operator<<((ostream *)&file,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::string((string *)&currentLine,pcVar4,(allocator *)&sourcefile);
        while (lVar6 = std::__cxx11::string::find((char *)&currentLine,0x1619b2), lVar6 == -1) {
          std::istream::getline((char *)&configfile,(long)pcVar4);
          std::__cxx11::string::assign((char *)&currentLine);
          poVar5 = std::operator<<((ostream *)&file,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        operator_delete__(pcVar4);
        poVar5 = std::operator<<((ostream *)&file,"<Build>");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::operator<<((ostream *)&file,"      <StartDateTime>");
        kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
                  (&sourcefile,(SystemTools *)"%b %d %H:%M:%S %z",format);
        std::operator<<((ostream *)&file,(string *)&sourcefile);
        std::__cxx11::string::~string((string *)&sourcefile);
        poVar5 = std::operator<<((ostream *)&file,"</StartDateTime>");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::operator<<((ostream *)&file,"      <StartBuildTime>");
        kwssys::SystemTools::GetTime();
        std::ostream::_M_insert<unsigned_long>((ulong)&file);
        poVar5 = std::operator<<((ostream *)&file,"</StartBuildTime>");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&file,"<BuildCommand>KWStyle</BuildCommand>");
        std::endl<char,std::char_traits<char>>(poVar5);
        this_00 = (this->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        local_7e0 = 0;
        do {
          if (this_00 ==
              (this->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>).
              _M_impl.super__Vector_impl_data._M_finish) break;
          std::__cxx11::string::string((string *)&sourcefile,(string *)&this_00->m_Filename);
          if (basedirectory->_M_string_length != 0) {
            std::__cxx11::string::substr((ulong)&desc,(ulong)&sourcefile);
            std::__cxx11::string::operator=((string *)&sourcefile,(string *)&desc);
            std::__cxx11::string::~string((string *)&desc);
          }
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                    (&errors,&this_00->m_ErrorList);
          bVar1 = true;
          pEVar8 = errors.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            if (pEVar8 == errors.
                          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                          _M_impl.super__Vector_impl_data._M_finish) break;
            if ((!group) || (bVar1)) {
              poVar5 = std::operator<<((ostream *)&file,"<Error>");
              std::endl<char,std::char_traits<char>>(poVar5);
              poVar5 = std::operator<<((ostream *)&file,"          <BuildLogLine>1</BuildLogLine>");
              std::endl<char,std::char_traits<char>>(poVar5);
              std::operator<<((ostream *)&file,"          <SourceFile>");
              std::operator<<((ostream *)&file,sourcefile._M_dataplus._M_p);
              poVar5 = std::operator<<((ostream *)&file,"</SourceFile>");
              std::endl<char,std::char_traits<char>>(poVar5);
              std::operator<<((ostream *)&file,"          <SourceLineNumber>");
              std::ostream::_M_insert<unsigned_long>((ulong)&file);
              poVar5 = std::operator<<((ostream *)&file,"</SourceLineNumber>");
              std::endl<char,std::char_traits<char>>(poVar5);
              if (url->_M_string_length != 0) {
                std::__cxx11::string::string((string *)&desc,(string *)&this_00->m_Filename);
                lVar6 = std::__cxx11::string::find((char *)&desc,0x1636f2);
                if (lVar6 != -1) {
                  std::__cxx11::string::substr((ulong)&local_720,(ulong)&desc);
                  std::__cxx11::string::operator=((string *)&desc,(string *)&local_720);
                  std::__cxx11::string::~string((string *)&local_720);
                }
                lVar6 = std::__cxx11::string::find((char *)&desc,0x161454);
                if (lVar6 != -1) {
                  std::__cxx11::string::substr((ulong)&local_720,(ulong)&desc);
                  std::__cxx11::string::operator=((string *)&desc,(string *)&local_720);
                  std::__cxx11::string::~string((string *)&local_720);
                }
                uVar7 = std::__cxx11::string::find_last_of((char *)&desc,0x155501);
                for (uVar9 = 0; (uVar7 != 0xffffffffffffffff && (uVar9 < this->m_MaxDirectoryDepth))
                    ; uVar9 = uVar9 + 1) {
                  std::__cxx11::string::replace((ulong)&desc,uVar7,(char *)0x1);
                  uVar7 = std::__cxx11::string::find_last_of((char *)&desc,0x155501);
                }
                lVar6 = std::__cxx11::string::find_last_of((char *)&desc,0x155501);
                if (lVar6 != -1) {
                  std::__cxx11::string::substr((ulong)&local_720,(ulong)&desc);
                  std::__cxx11::string::operator=((string *)&desc,(string *)&local_720);
                  std::__cxx11::string::~string((string *)&local_720);
                }
                std::__cxx11::string::append((char *)&desc);
                poVar5 = std::operator<<((ostream *)&file,"<Url>");
                poVar5 = std::operator<<(poVar5,(url->_M_dataplus)._M_p);
                poVar5 = std::operator<<(poVar5,"/");
                poVar5 = std::operator<<(poVar5,desc._M_dataplus._M_p);
                poVar5 = std::operator<<(poVar5,"</Url>");
                std::endl<char,std::char_traits<char>>(poVar5);
                poVar5 = std::operator<<((ostream *)&file,"<UrlName>View KWStyle File</UrlName>");
                std::endl<char,std::char_traits<char>>(poVar5);
                std::__cxx11::string::~string((string *)&desc);
              }
              std::operator<<((ostream *)&file,"          <Text>");
              bVar1 = false;
            }
            std::operator<<((ostream *)&file,sourcefile._M_dataplus._M_p);
            std::operator<<((ostream *)&file," : ");
            Parser::GetErrorTag_abi_cxx11_(&desc,this_00,pEVar8->number);
            std::operator<<((ostream *)&file,(string *)&desc);
            std::__cxx11::string::~string((string *)&desc);
            std::operator<<((ostream *)&file," : ");
            std::__cxx11::string::string((string *)&desc,(string *)&pEVar8->description);
            while (uVar7 = std::__cxx11::string::find((char *)&desc,0x161d38),
                  uVar7 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&desc,uVar7,(char *)0x1);
            }
            while (uVar7 = std::__cxx11::string::find((char *)&desc,0x162488),
                  uVar7 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&desc,uVar7,(char *)0x1);
            }
            while (uVar7 = std::__cxx11::string::find((char *)&desc,0x1619b2),
                  uVar7 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&desc,uVar7,(char *)0x1);
            }
            Parser::GetTestDescription_abi_cxx11_(&local_480,this_00,pEVar8->number);
            std::operator+(&local_460," [",&local_480);
            std::operator+(&local_720,&local_460,"] (");
            std::__cxx11::string::append((string *)&desc);
            std::__cxx11::string::~string((string *)&local_720);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_480);
            pcVar4 = (char *)operator_new__(0xff);
            snprintf(pcVar4,0xff,"%ld",pEVar8->line);
            std::__cxx11::string::append((char *)&desc);
            std::__cxx11::string::append((char *)&desc);
            operator_delete__(pcVar4);
            std::operator<<((ostream *)&file,(string *)&desc);
            if (!group) {
              poVar5 = std::operator<<((ostream *)&file,"</Text>");
              std::endl<char,std::char_traits<char>>(poVar5);
              std::operator<<((ostream *)&file,"          <PreContext>");
              poVar5 = std::operator<<((ostream *)&file,"</PreContext>");
              std::endl<char,std::char_traits<char>>(poVar5);
              std::operator<<((ostream *)&file,"<PostContext>");
              poVar5 = std::operator<<((ostream *)&file,"</PostContext>");
              std::endl<char,std::char_traits<char>>(poVar5);
              poVar5 = std::operator<<((ostream *)&file,"<RepeatCount>0</RepeatCount>");
              std::endl<char,std::char_traits<char>>(poVar5);
              poVar5 = std::operator<<((ostream *)&file,"</Error>");
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            pEVar8 = pEVar8 + 1;
            local_7e0 = local_7e0 + 1;
            std::__cxx11::string::~string((string *)&desc);
          } while (local_7e0 < maxError || maxError == -1);
          if ((group) && (!bVar1)) {
            poVar5 = std::operator<<((ostream *)&file,"</Text>");
            std::endl<char,std::char_traits<char>>(poVar5);
            std::operator<<((ostream *)&file,"          <PreContext>");
            poVar5 = std::operator<<((ostream *)&file,"</PreContext>");
            std::endl<char,std::char_traits<char>>(poVar5);
            std::operator<<((ostream *)&file,"<PostContext>");
            poVar5 = std::operator<<((ostream *)&file,"</PostContext>");
            std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<((ostream *)&file,"<RepeatCount>0</RepeatCount>");
            std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<((ostream *)&file,"</Error>");
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          this_00 = this_00 + 1;
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector(&errors);
          std::__cxx11::string::~string((string *)&sourcefile);
        } while (local_7e0 < maxError || maxError == -1);
        poVar5 = std::operator<<((ostream *)&file,
                                 " <Log Encoding=\"base64\" Compression=\"/bin/gzip\">");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&file,"      </Log>");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::operator<<((ostream *)&file,"      <EndDateTime>");
        kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
                  (&sourcefile,(SystemTools *)"%b %d %I:%M:%S %z",format_00);
        std::operator<<((ostream *)&file,(string *)&sourcefile);
        std::__cxx11::string::~string((string *)&sourcefile);
        poVar5 = std::operator<<((ostream *)&file,"</EndDateTime>");
        std::endl<char,std::char_traits<char>>(poVar5);
        dVar10 = kwssys::SystemTools::GetTime();
        pcVar4 = (char *)operator_new__(10);
        snprintf(pcVar4,10,"%.1f",(dVar10 - time) / 60.0);
        poVar5 = std::operator<<((ostream *)&file,"  <ElapsedMinutes>");
        poVar5 = std::operator<<(poVar5,pcVar4);
        poVar5 = std::operator<<(poVar5,"</ElapsedMinutes></Build>");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&file,"</Site>");
        std::endl<char,std::char_traits<char>>(poVar5);
        operator_delete__(pcVar4);
        std::ifstream::close();
        std::ofstream::close();
        poVar5 = std::operator<<((ostream *)&std::cout,"Done.");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&currentLine);
      }
      std::__cxx11::string::~string((string *)&filename);
      std::ofstream::~ofstream(&file);
    }
    std::ifstream::~ifstream(&configfile);
    std::__cxx11::string::~string((string *)&configname);
  }
  std::ifstream::~ifstream(&tagfile);
  std::__cxx11::string::~string((string *)&tag);
  std::__cxx11::string::~string((string *)&dirname);
  return (bool)cVar2;
}

Assistant:

bool Generator::GenerateDart(const char* dir,int maxError,
                             bool group,std::string url,
                             double time,std::string basedirectory)
{
  std::cout << "Generating Dart...";

  // We try to find the TAG file
  std::string dirname = dir;
  if(dir[strlen(dir)-1] != '/' && dir[strlen(dir)-1] != '\\')
    {
     dirname += "/";
    }
  dirname += "Testing/";

  std::string tag = dirname+"TAG";

  std::ifstream tagfile;
  tagfile.open(tag.c_str(), std::ios::binary | std::ios::in);
  if(!tagfile.is_open())
    {
    std::cout << "Cannot open file for reading: " << tag.c_str() << std::endl;
    return false;
    }

  // We read the first line of the file which gives the path to the actual
  // directory
  char* bufferTag = new char[255];
  tagfile.getline(bufferTag,255);

  if(bufferTag[strlen(bufferTag)-1] == '\r')
    {
    bufferTag[strlen(bufferTag)-1] = '\0';
    }

  dirname += bufferTag;
  dirname += "/";

  delete [] bufferTag;

  // We should have a Configure.xml file in the directory
  std::string configname = dirname+"Configure.xml";

  std::ifstream configfile;

  configfile.open(configname.c_str(), std::ios::binary | std::ios::in);
  if(!configfile.is_open())
    {
    std::cout << "Cannot open file for reading: " << configname.c_str() << std::endl;
    return false;
    }

  // Create the Build.xml file
  std::ofstream file;
  std::string filename = dirname+"Build.xml";

  file.open(filename.c_str(), std::ios::binary | std::ios::out);
  if(!file.is_open())
    {
    std::cout << "Cannot open file for writing: " <<  std::endl;
    return false;
    }

  // Generate the header
  char* buffer = new char[255];
  configfile.getline(buffer,255);
  file << buffer << std::endl;
  configfile.getline(buffer,255);
  file << buffer << std::endl;

  std::string currentLine = buffer;
  while(currentLine.find(">") == std::string::npos)
   {
   configfile.getline(buffer,255);
   currentLine = buffer;
   file << buffer << std::endl;
   }

  delete [] buffer;

  file << "<Build>" << std::endl;
  file << "      <StartDateTime>";
  file << kwssys::SystemTools::GetCurrentDateTime("%b %d %H:%M:%S %z");
  file << "</StartDateTime>" << std::endl;
  file << "      <StartBuildTime>";
  file << static_cast<unsigned int>(kwssys::SystemTools::GetTime());
  file << "</StartBuildTime>" << std::endl;
  file << "<BuildCommand>KWStyle</BuildCommand>" << std::endl;

  int nErrors = 0;
  ParserVectorType::const_iterator it = m_Parsers->begin();
  while(it != m_Parsers->end())
    {
    std::string sourcefile = (*it).GetFilename();
    if (!basedirectory.empty()) {
      sourcefile = sourcefile.substr(basedirectory.size());
    }

    bool first = true;
    const Parser::ErrorVectorType errors = (*it).GetErrors();
    auto itError = errors.begin();
    while(itError != errors.end())
      {
      if((!group) || (first && group))
        {
        file << "<Error>" << std::endl;
        file << "          <BuildLogLine>1</BuildLogLine>" << std::endl;
        file << "          <SourceFile>";
        file << sourcefile.c_str();
        file << "</SourceFile>" << std::endl;
        file << "          <SourceLineNumber>";
        file << (*itError).line;
        file << "</SourceLineNumber>" << std::endl;

        if (!url.empty()) {
          // We had a link to the dashboard
          /*long int posslash = (*it).GetFilename().find_last_of("/");
          long int posbackslash = (*it).GetFilename().find_last_of("\\");

          long int pos = 0;
          if(posslash != -1 && posslash>posbackslash)
            {
            pos = posslash;
            }

          if(posbackslash != -1 && posbackslash>posslash)
            {
            pos = posbackslash;
            }

          if(pos == 0)
            {
            pos++;
            }
          std::string htmlfile = (*it).GetFilename().substr(pos+1,(*it).GetFilename().size()-pos-1);
          */

          std::string htmlfile = (*it).GetFilename();
          if(long int pos = htmlfile.find(":/") != std::string::npos)
            {
            htmlfile = htmlfile.substr(pos+2,htmlfile.size()-pos-2);
            }
          if(long int pos = htmlfile.find(":\\") != std::string::npos)
            {
            htmlfile = htmlfile.substr(pos+2,htmlfile.size()-pos-2);
            }

            auto slash = static_cast<long int>(htmlfile.find_last_of("/"));
            unsigned int i = 0;
            while (slash != -1 && i < m_MaxDirectoryDepth) {
              htmlfile.replace(slash, 1, "_");
              slash = static_cast<long int>(htmlfile.find_last_of("/"));
              i++;
            }
          slash = static_cast<long int>(htmlfile.find_last_of("/"));
          if(slash != -1)
            {
            htmlfile = htmlfile.substr(slash+1,htmlfile.size()-slash-1);
            }

          htmlfile += ".html";
          file << "<Url>"<< url.c_str() << "/" << htmlfile.c_str() << "</Url>" << std::endl;
          file << "<UrlName>View KWStyle File</UrlName>" << std::endl;
        }
        first = false;
        file << "          <Text>";
        }

      file << sourcefile.c_str();
      file << " : ";
      file << (*it).GetErrorTag((*itError).number);
      file << " : ";
      std::string desc = (*itError).description;
      auto pos = static_cast<long int>(desc.find("&", 0));
      while(pos != -1)
        {
        desc.replace(pos,1,"&amp;");
        pos = static_cast<long int>(desc.find("&",pos+3));
        }
      pos = static_cast<long int>(desc.find("<"));
      while(pos != -1)
        {
        desc.replace(pos,1,"&#x03C;");
        pos = static_cast<long int>(desc.find("<"));
        }
      pos = static_cast<long int>(desc.find(">"));
      while(pos != -1)
        {
        desc.replace(pos,1,"&#x03E;");
        pos = static_cast<long int>(desc.find(">"));
        }

      desc += " ["+(*it).GetTestDescription((*itError).number)+"] (";
      constexpr size_t length = 255;
      char* val = new char[length];
      snprintf(val,length,"%ld",(*itError).line);
      desc += val;
      desc += ")\n";
      delete [] val;

      file << desc;

      if(!group)
        {
        file << "</Text>" << std::endl;
        // Show the actual error in the precontext
        file << "          <PreContext>";
        //file << (*it).GetTestDescription((*itError).number) << std::endl;
        file << "</PreContext>" << std::endl;
        file << "<PostContext>";
        file << "</PostContext>" << std::endl;
        file << "<RepeatCount>0</RepeatCount>" << std::endl;
        file << "</Error>" << std::endl;
        }
      itError++;
      nErrors++;
      if((maxError != -1) && (nErrors >= maxError))
        {
        break;
        }
      }

    if(group && !first)
      {
      file << "</Text>" << std::endl;
      // Show the actual error in the precontext
      file << "          <PreContext>";
      //file << (*it).GetTestDescription((*itError).number) << std::endl;
      file << "</PreContext>" << std::endl;
      file << "<PostContext>";
      file << "</PostContext>" << std::endl;
      file << "<RepeatCount>0</RepeatCount>" << std::endl;
      file << "</Error>" << std::endl;
      }

    if((maxError != -1) && (nErrors >= maxError))
      {
      break;
      }
    it++;
    }

  // Write the footer
    file << R"( <Log Encoding="base64" Compression="/bin/gzip">)" << std::endl;
    file << "      </Log>" << std::endl;
    file << "      <EndDateTime>";
    file << kwssys::SystemTools::GetCurrentDateTime("%b %d %I:%M:%S %z");
    file << "</EndDateTime>" << std::endl;

    double time1 = kwssys::SystemTools::GetTime();

    constexpr size_t length = 10;
    char *timestr = new char[length];
    snprintf(timestr, length, "%.1f", (time1 - time) / 60.0);

    file << "  <ElapsedMinutes>" << timestr << "</ElapsedMinutes></Build>"
         << std::endl;
    file << "</Site>" << std::endl;

    delete[] timestr;
    configfile.close();
    file.close();
    std::cout << "Done." << std::endl;
    return true;
 }